

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>::
SmallVector(SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>
            *this,Candidate *arg_list_begin,Candidate *arg_list_end)

{
  Candidate *pCVar1;
  size_t i;
  size_t sVar2;
  size_t count;
  
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
  buffer_size = 0;
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
       (Candidate *)&this->stack_storage;
  this->buffer_capacity = 9;
  count = (long)arg_list_end - (long)arg_list_begin >> 2;
  reserve(this,count);
  pCVar1 = (this->
           super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    pCVar1[sVar2] = arg_list_begin[sVar2];
  }
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
  buffer_size = count;
  return;
}

Assistant:

SmallVector(const T *arg_list_begin, const T *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}